

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

void __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericRegexSearch
          (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *this,GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *regex,
          CrtAllocator *allocator)

{
  bool bVar1;
  CrtAllocator *pCVar2;
  size_t size;
  uint32_t *puVar3;
  CrtAllocator *allocator_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *regex_local;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  this->regex_ = regex;
  this->allocator_ = allocator;
  this->ownAllocator_ = (CrtAllocator *)0x0;
  Stack<rapidjson::CrtAllocator>::Stack(&this->state0_,allocator,0);
  Stack<rapidjson::CrtAllocator>::Stack(&this->state1_,allocator,0);
  this->stateSet_ = (uint32_t *)0x0;
  bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsValid(this->regex_);
  if (!bVar1) {
    __assert_fail("regex_.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                  ,0x267,
                  "rapidjson::internal::GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<>>>::GenericRegexSearch(const RegexType &, Allocator *) [RegexType = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->allocator_ == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->allocator_ = pCVar2;
    this->ownAllocator_ = pCVar2;
  }
  pCVar2 = this->allocator_;
  size = GetStateSetSize(this);
  puVar3 = (uint32_t *)CrtAllocator::Malloc(pCVar2,size);
  this->stateSet_ = puVar3;
  Stack<rapidjson::CrtAllocator>::Reserve<unsigned_int>
            (&this->state0_,(ulong)this->regex_->stateCount_);
  Stack<rapidjson::CrtAllocator>::Reserve<unsigned_int>
            (&this->state1_,(ulong)this->regex_->stateCount_);
  return;
}

Assistant:

GenericRegexSearch(const RegexType& regex, Allocator* allocator = 0) : 
        regex_(regex), allocator_(allocator), ownAllocator_(0),
        state0_(allocator, 0), state1_(allocator, 0), stateSet_()
    {
        RAPIDJSON_ASSERT(regex_.IsValid());
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
        stateSet_ = static_cast<uint32_t*>(allocator_->Malloc(GetStateSetSize()));
        state0_.template Reserve<SizeType>(regex_.stateCount_);
        state1_.template Reserve<SizeType>(regex_.stateCount_);
    }